

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bits.cc
# Opt level: O0

int Bits::Log2Floor_Portable(uint32 n)

{
  int iVar1;
  uint uVar2;
  uint32 x;
  int shift;
  int i;
  uint32 value;
  int log;
  uint32 n_local;
  
  if (n == 0) {
    log = -1;
  }
  else {
    i = 0;
    shift = n;
    for (x = 4; -1 < (int)x; x = x - 1) {
      iVar1 = 1 << ((byte)x & 0x1f);
      uVar2 = (uint)shift >> ((byte)iVar1 & 0x1f);
      if (uVar2 != 0) {
        i = iVar1 + i;
        shift = uVar2;
      }
    }
    if (shift != 1) {
      __assert_fail("value == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/bits/bits.cc"
                    ,0x57,"static int Bits::Log2Floor_Portable(uint32)");
    }
    log = i;
  }
  return log;
}

Assistant:

int Bits::Log2Floor_Portable(uint32 n) {
  if (n == 0)
    return -1;
  int log = 0;
  uint32 value = n;
  for (int i = 4; i >= 0; --i) {
    int shift = (1 << i);
    uint32 x = value >> shift;
    if (x != 0) {
      value = x;
      log += shift;
    }
  }
  assert(value == 1);
  return log;
}